

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int notation3(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  if (tok == 0xf) {
    return 0x11;
  }
  if (tok == 0x1b) {
    state->handler = declClose;
    state->role_none = 0x11;
    return 0x13;
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
notation3(PROLOG_STATE *state,
          int tok,
          const char *UNUSED_P(ptr),
          const char *UNUSED_P(end),
          const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NOTATION_NONE;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    state->role_none = XML_ROLE_NOTATION_NONE;
    return XML_ROLE_NOTATION_SYSTEM_ID;
  }
  return common(state, tok);
}